

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::LookupLinkItems
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names,vector<cmLinkItem,_std::allocator<cmLinkItem>_> *items)

{
  int iVar1;
  cmGeneratorTarget *pcVar2;
  pointer item;
  string name;
  string local_80;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_60;
  cmLinkItem local_58;
  
  item = (names->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if (item != (names->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
    local_60 = items;
    do {
      CheckCMP0004(&local_80,this,item);
      if (local_80._M_string_length == (this->Target->Name)._M_string_length) {
        if ((local_80._M_string_length != 0) &&
           (iVar1 = bcmp(local_80._M_dataplus._M_p,(this->Target->Name)._M_dataplus._M_p,
                         local_80._M_string_length), iVar1 != 0)) {
LAB_0049bba2:
          pcVar2 = FindTargetToLink(this,&local_80);
          local_58.super_string._M_dataplus._M_p = (pointer)&local_58.super_string.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_58,local_80._M_dataplus._M_p,
                     local_80._M_dataplus._M_p + local_80._M_string_length);
          local_58.Target = pcVar2;
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                    (local_60,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58.super_string._M_dataplus._M_p != &local_58.super_string.field_2) {
            operator_delete(local_58.super_string._M_dataplus._M_p,
                            local_58.super_string.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else if (local_80._M_string_length != 0) goto LAB_0049bba2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      item = item + 1;
    } while (item != (names->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmGeneratorTarget::LookupLinkItems(std::vector<std::string> const& names,
                                        std::vector<cmLinkItem>& items) const
{
  for (std::vector<std::string>::const_iterator i = names.begin();
       i != names.end(); ++i) {
    std::string name = this->CheckCMP0004(*i);
    if (name == this->GetName() || name.empty()) {
      continue;
    }
    items.push_back(cmLinkItem(name, this->FindTargetToLink(name)));
  }
}